

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
* fmt::v5::to_string<fmt::v5::char8_t,500ul>
            (basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> *buf)

{
  char8_t *__n;
  char8_t *__s;
  basic_buffer<fmt::v5::char8_t> *in_RSI;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *in_RDI;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *__a;
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  *this;
  basic_buffer<fmt::v5::char8_t> *local_10;
  
  __a = in_RDI;
  local_10 = in_RSI;
  __n = internal::basic_buffer<fmt::v5::char8_t>::data(in_RSI);
  __s = (char8_t *)internal::basic_buffer<fmt::v5::char8_t>::size(local_10);
  this = (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
          *)&stack0xffffffffffffffef;
  std::allocator<fmt::v5::char8_t>::allocator((allocator<fmt::v5::char8_t> *)0x2dabc8);
  std::__cxx11::
  basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
  ::basic_string(this,__s,(size_type)__n,(allocator<fmt::v5::char8_t> *)__a);
  std::allocator<fmt::v5::char8_t>::~allocator((allocator<fmt::v5::char8_t> *)0x2dabed);
  return in_RDI;
}

Assistant:

std::basic_string<Char> to_string(const basic_memory_buffer<Char, SIZE> &buf) {
  return std::basic_string<Char>(buf.data(), buf.size());
}